

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O0

void __thiscall ProblemFOBSFireFightingFactored::SetYScopes(ProblemFOBSFireFightingFactored *this)

{
  MultiAgentDecisionProcessDiscreteFactoredStates *pMVar1;
  MultiAgentDecisionProcessDiscreteFactoredStates *this_00;
  long *in_RDI;
  Scope x;
  Index yI;
  Index agI;
  Scope allAgents;
  string *in_stack_000000e8;
  Scope *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  allocator<char> *in_stack_ffffffffffffff50;
  allocator<char> local_89;
  string local_88 [8];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  uint local_38;
  uint local_24;
  
  Scope::Scope((Scope *)in_stack_ffffffffffffff50);
  local_24 = 0;
  while( true ) {
    pMVar1 = (MultiAgentDecisionProcessDiscreteFactoredStates *)(ulong)local_24;
    this_00 = (MultiAgentDecisionProcessDiscreteFactoredStates *)(**(code **)(*in_RDI + 0x10))();
    if (this_00 <= pMVar1) break;
    Scope::Insert((Scope *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_24 = local_24 + 1;
  }
  for (local_38 = 0; (ulong)local_38 < (ulong)in_RDI[0xe2]; local_38 = local_38 + 1) {
    Scope::Scope((Scope *)in_stack_ffffffffffffff50);
    if (local_38 != 0) {
      Scope::Insert((Scope *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    Scope::Insert((Scope *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if ((ulong)local_38 < in_RDI[0xe2] - 1U) {
      Scope::Insert((Scope *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    in_stack_ffffffffffffff50 = &local_89;
    in_stack_ffffffffffffff4c = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Scope::Scope(in_stack_000000f0,in_stack_000000e8);
    MultiAgentDecisionProcessDiscreteFactoredStates::SetSoI_Y
              (this_00,(Index)((ulong)pMVar1 >> 0x20),(Scope *)in_stack_ffffffffffffff50,
               (Scope *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (Scope *)0x9a6d8b);
    Scope::~Scope((Scope *)0x9a6d97);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    Scope::~Scope((Scope *)0x9a6db5);
  }
  Scope::~Scope((Scope *)0x9a6e42);
  return;
}

Assistant:

void ProblemFOBSFireFightingFactored::SetYScopes()
{    
    //specify connections for the 2DBN
#if DEBUG_PFFF
    cout << "About to set the SoIs for all next-stage(NS) SFs Y..."<<endl;
#endif
    Scope allAgents;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        allAgents.Insert(agI);
    for(Index yI=0; yI < _m_nrHouses; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        if(yI > 0)
            x.Insert(yI-1);
        x.Insert(yI); // firelevel of house yI influenced by its PS firelevel
        if(yI < (_m_nrHouses-1) )
            x.Insert(yI+1);

        SetSoI_Y( yI, //sfacI = 0 -> house 0
                  x,
                  allAgents,
                  Scope("<>") // no interdependencies between next-stage FLs
                  );
    }
}